

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BerdyHelper.cpp
# Opt level: O2

bool __thiscall
iDynTree::BerdyHelper::serializeSensorVariables
          (BerdyHelper *this,SensorsMeasurements *sensMeas,LinkNetExternalWrenches *netExtWrenches,
          JointDOFsDoubleArray *jointTorques,JointDOFsDoubleArray *jointAccs,
          LinkInternalWrenches *linkJointWrenches,SpatialForceVector *rcm,VectorDynSize *y)

{
  undefined8 uVar1;
  pointer plVar2;
  undefined1 uVar3;
  ptrdiff_t pVar4;
  long lVar5;
  undefined8 *puVar6;
  long lVar7;
  SpatialForceVector *vec;
  size_t i;
  JointDOFsDoubleArray *wrench;
  DOFIndex idx;
  ulong uVar8;
  DOFIndex idx_1;
  IndexRange IVar9;
  IndexRange range;
  IndexRange range_00;
  IndexRange range_01;
  Transform local_100 [56];
  Wrench local_c8;
  Matrix<double,_6,_1,_0,_6,_1> local_68;
  
  wrench = jointAccs;
  uVar3 = iDynTree::SensorsMeasurements::toVector((VectorDynSize *)sensMeas);
  pVar4 = iDynTree::VectorDynSize::size();
  toEigen((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_c8,
          &this->realSensorMeas);
  IVar9.size = (ptrdiff_t)&local_c8;
  IVar9.offset = pVar4;
  setSubVector<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>>
            ((iDynTree *)y,(VectorDynSize *)0x0,IVar9,
             (Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)wrench);
  if ((this->m_options).includeAllJointAccelerationsAsSensors == true) {
    uVar8 = 0;
    while( true ) {
      lVar5 = iDynTree::Model::getNrOfDOFs();
      if (lVar5 <= (long)uVar8) break;
      IVar9 = getRangeDOFSensorVariable(this,DOF_ACCELERATION_SENSOR,uVar8);
      puVar6 = (undefined8 *)iDynTree::VectorDynSize::operator()((VectorDynSize *)jointAccs,uVar8);
      uVar1 = *puVar6;
      puVar6 = (undefined8 *)iDynTree::VectorDynSize::operator()(y,IVar9.offset);
      *puVar6 = uVar1;
      uVar8 = uVar8 + 1;
    }
  }
  if ((this->m_options).includeAllJointTorquesAsSensors == true) {
    uVar8 = 0;
    while( true ) {
      lVar5 = iDynTree::Model::getNrOfDOFs();
      if (lVar5 <= (long)uVar8) break;
      IVar9 = getRangeDOFSensorVariable(this,DOF_TORQUE_SENSOR,uVar8);
      puVar6 = (undefined8 *)
               iDynTree::VectorDynSize::operator()((VectorDynSize *)jointTorques,uVar8);
      uVar1 = *puVar6;
      puVar6 = (undefined8 *)iDynTree::VectorDynSize::operator()(y,IVar9.offset);
      *puVar6 = uVar1;
      uVar8 = uVar8 + 1;
    }
  }
  if ((this->m_options).includeAllNetExternalWrenchesAsSensors == true) {
    lVar5 = 0;
    while( true ) {
      lVar7 = iDynTree::Model::getNrOfLinks();
      if (lVar7 <= lVar5) break;
      if ((this->m_options).berdyVariant == ORIGINAL_BERDY_FIXED_BASE) {
        iDynTree::Traversal::getBaseLink();
        lVar7 = iDynTree::Link::getIndex();
        if ((lVar5 != lVar7) || ((this->m_options).includeFixedBaseExternalWrench == true))
        goto LAB_001aedf0;
      }
      else {
LAB_001aedf0:
        IVar9 = getRangeLinkSensorVariable(this,NET_EXT_WRENCH_SENSOR,lVar5);
        iDynTree::Transform::inverse();
        iDynTree::LinkWrenches::operator()(netExtWrenches,lVar5);
        iDynTree::Transform::operator*(local_100,&local_c8);
        toEigen(&local_68,(SpatialForceVector *)local_100);
        range.size = (ptrdiff_t)&local_68;
        range.offset = 6;
        setSubVector<Eigen::Matrix<double,6,1,0,6,1>>
                  ((iDynTree *)y,(VectorDynSize *)IVar9.offset,range,
                   (Matrix<double,_6,_1,_0,_6,_1> *)wrench);
        iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)local_100);
      }
      lVar5 = lVar5 + 1;
    }
  }
  for (uVar8 = 0;
      plVar2 = (this->berdySensorsInfo).wrenchSensors.
               super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
               _M_start,
      uVar8 < (ulong)((long)(this->berdySensorsInfo).wrenchSensors.
                            super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)plVar2 >> 3);
      uVar8 = uVar8 + 1) {
    IVar9 = getRangeJointSensorVariable(this,JOINT_WRENCH_SENSOR,plVar2[uVar8]);
    lVar5 = iDynTree::Traversal::getChildLinkIndexFromJointIndex
                      ((Model *)&this->m_dynamicsTraversal,(long)this);
    vec = (SpatialForceVector *)iDynTree::LinkWrenches::operator()(linkJointWrenches,lVar5);
    toEigen((Matrix<double,_6,_1,_0,_6,_1> *)&local_c8,vec);
    range_00.size = (ptrdiff_t)&local_c8;
    range_00.offset = 6;
    setSubVector<Eigen::Matrix<double,6,1,0,6,1>>
              ((iDynTree *)y,(VectorDynSize *)IVar9.offset,range_00,
               (Matrix<double,_6,_1,_0,_6,_1> *)wrench);
  }
  if ((this->m_options).berdyVariant == BERDY_FLOATING_BASE_NON_COLLOCATED_EXT_WRENCHES) {
    IVar9 = getRangeRCMSensorVariable(this,RCM_SENSOR);
    range_01.size = (ptrdiff_t)rcm;
    range_01.offset = 6;
    setSubVector((iDynTree *)y,(VectorDynSize *)IVar9.offset,range_01,(SpatialForceVector *)wrench);
  }
  return (bool)uVar3;
}

Assistant:

bool BerdyHelper::serializeSensorVariables(SensorsMeasurements& sensMeas,
                                           LinkNetExternalWrenches& netExtWrenches,
                                           JointDOFsDoubleArray& jointTorques,
                                           JointDOFsDoubleArray& jointAccs,
                                           LinkInternalWrenches& linkJointWrenches,
                                           SpatialForceVector& rcm,
                                           VectorDynSize& y)
{
    bool ret=true;
    assert(y.size() == this->getNrOfSensorsMeasurements());

    bool ok = sensMeas.toVector(realSensorMeas);
    ret = ret && ok;

    // The first part of the sensor vector is exactly the serialization of the sensMeas object
    IndexRange ran;
    ran.offset = 0;
    ran.size = realSensorMeas.size();
    setSubVector(y,ran,toEigen(realSensorMeas));

    // Then we need to follow the serialization used in computeBerdySensorMatrices

     ////////////////////////////////////////////////////////////////////////
    ///// JOINT ACCELERATIONS
    ////////////////////////////////////////////////////////////////////////
    if( m_options.includeAllJointAccelerationsAsSensors )
    {
        for(DOFIndex idx = 0; idx < static_cast<DOFIndex>(m_model.getNrOfDOFs()); idx++)
        {
            IndexRange sensorRange = this->getRangeDOFSensorVariable(DOF_ACCELERATION_SENSOR,idx);

            setSubVector(y,sensorRange,jointAccs(idx));
        }
    }

    ////////////////////////////////////////////////////////////////////////
    ///// JOINT TORQUES
    ////////////////////////////////////////////////////////////////////////
    if( m_options.includeAllJointTorquesAsSensors )
    {
        for(DOFIndex idx = 0; idx < static_cast<DOFIndex>(m_model.getNrOfDOFs()); idx++)
        {
            IndexRange sensorRange = this->getRangeDOFSensorVariable(DOF_TORQUE_SENSOR,idx);

            setSubVector(y,sensorRange,jointTorques(idx));
        }
    }

    ////////////////////////////////////////////////////////////////////////
    ///// NET EXTERNAL WRENCHES ACTING ON LINKS
    ////////////////////////////////////////////////////////////////////////
    if( m_options.includeAllNetExternalWrenchesAsSensors )
    {
        for(LinkIndex idx = 0; idx < static_cast<LinkIndex>(m_model.getNrOfLinks()); idx++)
        {
            if( !(m_options.berdyVariant == ORIGINAL_BERDY_FIXED_BASE &&
                  m_dynamicsTraversal.getBaseLink()->getIndex() == idx) ||
                 m_options.includeFixedBaseExternalWrench  )
            {
                IndexRange sensorRange = this->getRangeLinkSensorVariable(NET_EXT_WRENCH_SENSOR,idx);

                setSubVector(y,sensorRange,toEigen(m_link_H_externalWrenchMeasurementFrame[idx].inverse()*netExtWrenches(idx)));
            }
        }
    }

    ////////////////////////////////////////////////////////////////////////
    ///// JOINT WRENCHES
    ////////////////////////////////////////////////////////////////////////
    for(size_t i = 0; i < this->berdySensorsInfo.wrenchSensors.size(); i++)
    {
        IndexRange sensorRange = this->getRangeJointSensorVariable(JOINT_WRENCH_SENSOR,berdySensorsInfo.wrenchSensors[i]);

        LinkIndex childLink = m_dynamicsTraversal.getChildLinkIndexFromJointIndex(m_model,berdySensorsInfo.wrenchSensors[i]);
        setSubVector(y,sensorRange,toEigen(linkJointWrenches(childLink)));
    }

    ////////////////////////////////////////////////////////////////////////
    ///// Rate of Change of Momentum (RCM)
    ////////////////////////////////////////////////////////////////////////
    /// This method serializeSensorVariables is used in Testing for the Berdy estimator helper class
    if (m_options.berdyVariant==BERDY_FLOATING_BASE_NON_COLLOCATED_EXT_WRENCHES)
    {
        IndexRange sensorRange = this->getRangeRCMSensorVariable(RCM_SENSOR);

        setSubVector(y, sensorRange, rcm);
    }

    return ret;
}